

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  float *pfVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  Ref<embree::Geometry> *pRVar9;
  Geometry *pGVar10;
  long lVar11;
  long lVar12;
  RTCIntersectArguments *pRVar13;
  RTCRayQueryContext *pRVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined8 uVar18;
  uint uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  uint uVar27;
  AABBNodeMB4D *node1;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  int iVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ulong unaff_R12;
  size_t mask;
  byte bVar39;
  ulong uVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined4 uVar89;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  float fVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined8 uVar98;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  undefined1 auVar106 [32];
  undefined1 auVar107 [64];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [32];
  undefined1 auVar112 [64];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 in_ZMM21 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_27e4;
  Scene *local_27e0;
  RTCFilterFunctionNArguments local_27d8;
  ulong local_27a8;
  ulong local_27a0;
  ulong local_2798;
  ulong local_2790;
  ulong local_2788;
  ulong local_2780;
  ulong local_2778;
  ulong *local_2770;
  ulong local_2768;
  long local_2760;
  long local_2758;
  float local_2750;
  undefined4 local_274c;
  undefined4 local_2748;
  undefined4 local_2744;
  undefined4 local_2740;
  undefined4 local_273c;
  uint local_2738;
  uint local_2734;
  uint local_2730;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  undefined4 uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  undefined4 uStack_23e4;
  float local_23e0 [4];
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  uint uStack_23c4;
  undefined1 local_23c0;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2398[0] = 0;
    if (local_23a0 != 8) {
      aVar8 = (ray->super_RayK<1>).dir.field_0;
      auVar66 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar54 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar42._8_4_ = 0x7fffffff;
      auVar42._0_8_ = 0x7fffffff7fffffff;
      auVar42._12_4_ = 0x7fffffff;
      auVar42 = vandps_avx512vl((undefined1  [16])aVar8,auVar42);
      local_2770 = local_2390;
      auVar43._8_4_ = 0x219392ef;
      auVar43._0_8_ = 0x219392ef219392ef;
      auVar43._12_4_ = 0x219392ef;
      uVar41 = vcmpps_avx512vl(auVar42,auVar43,1);
      auVar63._8_4_ = 0x3f800000;
      auVar63._0_8_ = &DAT_3f8000003f800000;
      auVar63._12_4_ = 0x3f800000;
      auVar42 = vdivps_avx(auVar63,(undefined1  [16])aVar8);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar15 = (bool)((byte)uVar41 & 1);
      auVar50._0_4_ = (uint)bVar15 * auVar43._0_4_ | (uint)!bVar15 * auVar42._0_4_;
      bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
      auVar50._4_4_ = (uint)bVar15 * auVar43._4_4_ | (uint)!bVar15 * auVar42._4_4_;
      bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
      auVar50._8_4_ = (uint)bVar15 * auVar43._8_4_ | (uint)!bVar15 * auVar42._8_4_;
      bVar15 = (bool)((byte)(uVar41 >> 3) & 1);
      auVar50._12_4_ = (uint)bVar15 * auVar43._12_4_ | (uint)!bVar15 * auVar42._12_4_;
      auVar44._8_4_ = 0x3f7ffffa;
      auVar44._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar44._12_4_ = 0x3f7ffffa;
      auVar44 = vmulps_avx512vl(auVar50,auVar44);
      auVar45._8_4_ = 0x3f800003;
      auVar45._0_8_ = 0x3f8000033f800003;
      auVar45._12_4_ = 0x3f800003;
      auVar45 = vmulps_avx512vl(auVar50,auVar45);
      uVar89 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_25c0._4_4_ = uVar89;
      local_25c0._0_4_ = uVar89;
      local_25c0._8_4_ = uVar89;
      local_25c0._12_4_ = uVar89;
      local_25c0._16_4_ = uVar89;
      local_25c0._20_4_ = uVar89;
      local_25c0._24_4_ = uVar89;
      local_25c0._28_4_ = uVar89;
      auVar105 = ZEXT3264(local_25c0);
      uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_25e0._4_4_ = uVar89;
      local_25e0._0_4_ = uVar89;
      local_25e0._8_4_ = uVar89;
      local_25e0._12_4_ = uVar89;
      local_25e0._16_4_ = uVar89;
      local_25e0._20_4_ = uVar89;
      local_25e0._24_4_ = uVar89;
      local_25e0._28_4_ = uVar89;
      auVar107 = ZEXT3264(local_25e0);
      uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_2600._4_4_ = uVar89;
      local_2600._0_4_ = uVar89;
      local_2600._8_4_ = uVar89;
      local_2600._12_4_ = uVar89;
      local_2600._16_4_ = uVar89;
      local_2600._20_4_ = uVar89;
      local_2600._24_4_ = uVar89;
      local_2600._28_4_ = uVar89;
      auVar110 = ZEXT3264(local_2600);
      fVar95 = auVar44._0_4_;
      local_2620._4_4_ = fVar95;
      local_2620._0_4_ = fVar95;
      local_2620._8_4_ = fVar95;
      local_2620._12_4_ = fVar95;
      local_2620._16_4_ = fVar95;
      local_2620._20_4_ = fVar95;
      local_2620._24_4_ = fVar95;
      local_2620._28_4_ = fVar95;
      auVar112 = ZEXT3264(local_2620);
      auVar42 = vmovshdup_avx(auVar44);
      uVar98 = auVar42._0_8_;
      local_2640._8_8_ = uVar98;
      local_2640._0_8_ = uVar98;
      local_2640._16_8_ = uVar98;
      local_2640._24_8_ = uVar98;
      auVar114 = ZEXT3264(local_2640);
      auVar43 = vshufpd_avx(auVar44,auVar44,1);
      auVar73._8_4_ = 2;
      auVar73._0_8_ = 0x200000002;
      auVar73._12_4_ = 2;
      auVar73._16_4_ = 2;
      auVar73._20_4_ = 2;
      auVar73._24_4_ = 2;
      auVar73._28_4_ = 2;
      local_2660 = vpermps_avx2(auVar73,ZEXT1632(auVar44));
      auVar116 = ZEXT3264(local_2660);
      auVar68._8_4_ = 1;
      auVar68._0_8_ = 0x100000001;
      auVar68._12_4_ = 1;
      auVar68._16_4_ = 1;
      auVar68._20_4_ = 1;
      auVar68._24_4_ = 1;
      auVar68._28_4_ = 1;
      uVar89 = auVar45._0_4_;
      local_2680._4_4_ = uVar89;
      local_2680._0_4_ = uVar89;
      local_2680._8_4_ = uVar89;
      local_2680._12_4_ = uVar89;
      local_2680._16_4_ = uVar89;
      local_2680._20_4_ = uVar89;
      local_2680._24_4_ = uVar89;
      local_2680._28_4_ = uVar89;
      auVar119 = ZEXT3264(local_2680);
      local_26a0 = vpermps_avx2(auVar68,ZEXT1632(auVar45));
      auVar121 = ZEXT3264(local_26a0);
      local_26c0 = vpermps_avx512vl(auVar73,ZEXT1632(auVar45));
      auVar122 = ZEXT3264(local_26c0);
      local_2780 = (ulong)(fVar95 < 0.0) << 5;
      local_2788 = (ulong)(auVar42._0_4_ < 0.0) << 5 | 0x40;
      local_2790 = (ulong)(auVar43._0_4_ < 0.0) << 5 | 0x80;
      local_26e0 = vbroadcastss_avx512vl(auVar66);
      auVar123 = ZEXT3264(local_26e0);
      uVar89 = auVar54._0_4_;
      auVar94 = ZEXT3264(CONCAT428(uVar89,CONCAT424(uVar89,CONCAT420(uVar89,CONCAT416(uVar89,
                                                  CONCAT412(uVar89,CONCAT48(uVar89,CONCAT44(uVar89,
                                                  uVar89))))))));
      auVar68 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
      auVar124 = ZEXT3264(auVar68);
      auVar68 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
      auVar125 = ZEXT3264(auVar68);
      local_2798 = local_2780 ^ 0x20;
      local_27a0 = local_2788 ^ 0x20;
      local_27a8 = local_2790 ^ 0x20;
      uVar41 = local_2790 ^ 0x20;
      uVar30 = local_2780;
      uVar34 = local_2788;
      uVar35 = local_2790;
      uVar37 = local_2780 ^ 0x20;
      uVar38 = local_2788 ^ 0x20;
      do {
        do {
          do {
            if (local_2770 == &local_23a0) {
              return;
            }
            pfVar7 = (float *)(local_2770 + -1);
            local_2770 = local_2770 + -2;
          } while ((ray->super_RayK<1>).tfar < *pfVar7);
          uVar40 = *local_2770;
          do {
            auVar75 = auVar123._0_32_;
            auVar74 = auVar122._0_32_;
            auVar87 = auVar110._0_32_;
            auVar73 = auVar107._0_32_;
            auVar68 = auVar105._0_32_;
            if ((uVar40 & 8) == 0) {
              uVar28 = uVar40 & 0xfffffffffffffff0;
              uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
              auVar78._4_4_ = uVar89;
              auVar78._0_4_ = uVar89;
              auVar78._8_4_ = uVar89;
              auVar78._12_4_ = uVar89;
              auVar78._16_4_ = uVar89;
              auVar78._20_4_ = uVar89;
              auVar78._24_4_ = uVar89;
              auVar78._28_4_ = uVar89;
              auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar28 + 0x100 + uVar30),auVar78,
                                        *(undefined1 (*) [32])(uVar28 + 0x40 + uVar30));
              auVar71 = vsubps_avx(ZEXT1632(auVar42),auVar68);
              auVar69._4_4_ = auVar112._4_4_ * auVar71._4_4_;
              auVar69._0_4_ = auVar112._0_4_ * auVar71._0_4_;
              auVar69._8_4_ = auVar112._8_4_ * auVar71._8_4_;
              auVar69._12_4_ = auVar112._12_4_ * auVar71._12_4_;
              auVar69._16_4_ = auVar112._16_4_ * auVar71._16_4_;
              auVar69._20_4_ = auVar112._20_4_ * auVar71._20_4_;
              auVar69._24_4_ = auVar112._24_4_ * auVar71._24_4_;
              auVar69._28_4_ = auVar71._28_4_;
              auVar69 = vmaxps_avx512vl(auVar75,auVar69);
              auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar28 + 0x100 + uVar34),auVar78,
                                        *(undefined1 (*) [32])(uVar28 + 0x40 + uVar34));
              auVar71 = vsubps_avx(ZEXT1632(auVar42),auVar73);
              auVar70._4_4_ = auVar114._4_4_ * auVar71._4_4_;
              auVar70._0_4_ = auVar114._0_4_ * auVar71._0_4_;
              auVar70._8_4_ = auVar114._8_4_ * auVar71._8_4_;
              auVar70._12_4_ = auVar114._12_4_ * auVar71._12_4_;
              auVar70._16_4_ = auVar114._16_4_ * auVar71._16_4_;
              auVar70._20_4_ = auVar114._20_4_ * auVar71._20_4_;
              auVar70._24_4_ = auVar114._24_4_ * auVar71._24_4_;
              auVar70._28_4_ = auVar71._28_4_;
              auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar28 + 0x100 + uVar35),auVar78,
                                        *(undefined1 (*) [32])(uVar28 + 0x40 + uVar35));
              auVar71 = vsubps_avx(ZEXT1632(auVar42),auVar87);
              auVar72._4_4_ = auVar116._4_4_ * auVar71._4_4_;
              auVar72._0_4_ = auVar116._0_4_ * auVar71._0_4_;
              auVar72._8_4_ = auVar116._8_4_ * auVar71._8_4_;
              auVar72._12_4_ = auVar116._12_4_ * auVar71._12_4_;
              auVar72._16_4_ = auVar116._16_4_ * auVar71._16_4_;
              auVar72._20_4_ = auVar116._20_4_ * auVar71._20_4_;
              auVar72._24_4_ = auVar116._24_4_ * auVar71._24_4_;
              auVar72._28_4_ = auVar71._28_4_;
              auVar71 = vmaxps_avx(auVar70,auVar72);
              auVar70 = vmaxps_avx512vl(auVar69,auVar71);
              in_ZMM21 = ZEXT3264(auVar70);
              auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar28 + 0x100 + uVar37),auVar78,
                                        *(undefined1 (*) [32])(uVar28 + 0x40 + uVar37));
              auVar71 = vsubps_avx(ZEXT1632(auVar42),auVar68);
              auVar76._4_4_ = auVar119._4_4_ * auVar71._4_4_;
              auVar76._0_4_ = auVar119._0_4_ * auVar71._0_4_;
              auVar76._8_4_ = auVar119._8_4_ * auVar71._8_4_;
              auVar76._12_4_ = auVar119._12_4_ * auVar71._12_4_;
              auVar76._16_4_ = auVar119._16_4_ * auVar71._16_4_;
              auVar76._20_4_ = auVar119._20_4_ * auVar71._20_4_;
              auVar76._24_4_ = auVar119._24_4_ * auVar71._24_4_;
              auVar76._28_4_ = auVar71._28_4_;
              auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar28 + 0x100 + uVar38),auVar78,
                                        *(undefined1 (*) [32])(uVar28 + 0x40 + uVar38));
              auVar71 = vsubps_avx(ZEXT1632(auVar42),auVar73);
              auVar77._4_4_ = auVar121._4_4_ * auVar71._4_4_;
              auVar77._0_4_ = auVar121._0_4_ * auVar71._0_4_;
              auVar77._8_4_ = auVar121._8_4_ * auVar71._8_4_;
              auVar77._12_4_ = auVar121._12_4_ * auVar71._12_4_;
              auVar77._16_4_ = auVar121._16_4_ * auVar71._16_4_;
              auVar77._20_4_ = auVar121._20_4_ * auVar71._20_4_;
              auVar77._24_4_ = auVar121._24_4_ * auVar71._24_4_;
              auVar77._28_4_ = auVar71._28_4_;
              auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar28 + 0x100 + uVar41),auVar78,
                                        *(undefined1 (*) [32])(uVar28 + 0x40 + uVar41));
              auVar71 = vsubps_avx(ZEXT1632(auVar42),auVar87);
              auVar71 = vmulps_avx512vl(auVar74,auVar71);
              auVar71 = vminps_avx(auVar77,auVar71);
              auVar69 = vminps_avx(auVar94._0_32_,auVar76);
              auVar71 = vminps_avx(auVar69,auVar71);
              if (((uint)uVar40 & 7) == 6) {
                uVar98 = vcmpps_avx512vl(auVar70,auVar71,2);
                uVar17 = vcmpps_avx512vl(auVar78,*(undefined1 (*) [32])(uVar28 + 0x1c0),0xd);
                uVar18 = vcmpps_avx512vl(auVar78,*(undefined1 (*) [32])(uVar28 + 0x1e0),1);
                bVar39 = (byte)uVar98 & (byte)uVar17 & (byte)uVar18;
              }
              else {
                uVar98 = vcmpps_avx512vl(auVar70,auVar71,2);
                bVar39 = (byte)uVar98;
              }
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)bVar39);
            }
            if ((uVar40 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar33 = 4;
              }
              else {
                auVar71 = *(undefined1 (*) [32])(uVar40 & 0xfffffffffffffff0);
                auVar69 = ((undefined1 (*) [32])(uVar40 & 0xfffffffffffffff0))[1];
                auVar70 = vmovdqa64_avx512vl(auVar124._0_32_);
                auVar76 = in_ZMM21._0_32_;
                auVar70 = vpternlogd_avx512vl(auVar70,auVar76,auVar125._0_32_,0xf8);
                uVar40 = unaff_R12 & 0xffffffff;
                auVar72 = vpcompressd_avx512vl(auVar70);
                bVar15 = (bool)((byte)uVar40 & 1);
                auVar79._0_4_ = (uint)bVar15 * auVar72._0_4_ | (uint)!bVar15 * auVar70._0_4_;
                bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                auVar79._4_4_ = (uint)bVar15 * auVar72._4_4_ | (uint)!bVar15 * auVar70._4_4_;
                bVar15 = (bool)((byte)(uVar40 >> 2) & 1);
                auVar79._8_4_ = (uint)bVar15 * auVar72._8_4_ | (uint)!bVar15 * auVar70._8_4_;
                bVar15 = (bool)((byte)(uVar40 >> 3) & 1);
                auVar79._12_4_ = (uint)bVar15 * auVar72._12_4_ | (uint)!bVar15 * auVar70._12_4_;
                bVar15 = (bool)((byte)(uVar40 >> 4) & 1);
                auVar79._16_4_ = (uint)bVar15 * auVar72._16_4_ | (uint)!bVar15 * auVar70._16_4_;
                bVar15 = (bool)((byte)(uVar40 >> 5) & 1);
                auVar79._20_4_ = (uint)bVar15 * auVar72._20_4_ | (uint)!bVar15 * auVar70._20_4_;
                bVar15 = (bool)((byte)(uVar40 >> 6) & 1);
                auVar79._24_4_ = (uint)bVar15 * auVar72._24_4_ | (uint)!bVar15 * auVar70._24_4_;
                bVar15 = (bool)((byte)(uVar40 >> 7) & 1);
                auVar79._28_4_ = (uint)bVar15 * auVar72._28_4_ | (uint)!bVar15 * auVar70._28_4_;
                auVar70 = vpermt2q_avx512vl(auVar71,auVar79,auVar69);
                uVar40 = auVar70._0_8_;
                iVar33 = 0;
                uVar28 = unaff_R12 - 1 & unaff_R12;
                if (uVar28 != 0) {
                  auVar70 = vpshufd_avx2(auVar79,0x55);
                  vpermt2q_avx512vl(auVar71,auVar70,auVar69);
                  auVar72 = vpminsd_avx2(auVar79,auVar70);
                  auVar70 = vpmaxsd_avx2(auVar79,auVar70);
                  uVar28 = uVar28 - 1 & uVar28;
                  if (uVar28 == 0) {
                    auVar68 = vpermi2q_avx512vl(auVar72,auVar71,auVar69);
                    uVar40 = auVar68._0_8_;
                    auVar68 = vpermt2q_avx512vl(auVar71,auVar70,auVar69);
                    *local_2770 = auVar68._0_8_;
                    auVar68 = vpermd_avx512vl(auVar70,auVar76);
                    *(int *)(local_2770 + 1) = auVar68._0_4_;
                    local_2770 = local_2770 + 2;
                  }
                  else {
                    auVar78 = vpshufd_avx2(auVar79,0xaa);
                    vpermt2q_avx512vl(auVar71,auVar78,auVar69);
                    auVar77 = vpminsd_avx2(auVar72,auVar78);
                    auVar72 = vpmaxsd_avx2(auVar72,auVar78);
                    auVar78 = vpminsd_avx2(auVar70,auVar72);
                    auVar70 = vpmaxsd_avx2(auVar70,auVar72);
                    uVar28 = uVar28 - 1 & uVar28;
                    if (uVar28 == 0) {
                      auVar68 = vpermi2q_avx512vl(auVar77,auVar71,auVar69);
                      uVar40 = auVar68._0_8_;
                      auVar68 = vpermt2q_avx512vl(auVar71,auVar70,auVar69);
                      *local_2770 = auVar68._0_8_;
                      auVar68 = vpermd_avx512vl(auVar70,auVar76);
                      *(int *)(local_2770 + 1) = auVar68._0_4_;
                      auVar68 = vpermt2q_avx512vl(auVar71,auVar78,auVar69);
                      local_2770[2] = auVar68._0_8_;
                      auVar68 = vpermd_avx512vl(auVar78,auVar76);
                      *(int *)(local_2770 + 3) = auVar68._0_4_;
                      local_2770 = local_2770 + 4;
                    }
                    else {
                      auVar84 = vmovdqa64_avx512vl(auVar76);
                      auVar85 = vmovdqa64_avx512vl(auVar125._0_32_);
                      auVar83 = vmovdqa64_avx512vl(auVar124._0_32_);
                      auVar72 = vpshufd_avx2(auVar79,0xff);
                      vpermt2q_avx512vl(auVar71,auVar72,auVar69);
                      auVar76 = vpminsd_avx2(auVar77,auVar72);
                      auVar72 = vpmaxsd_avx2(auVar77,auVar72);
                      auVar77 = vpminsd_avx2(auVar78,auVar72);
                      auVar72 = vpmaxsd_avx2(auVar78,auVar72);
                      auVar78 = vpminsd_avx2(auVar70,auVar72);
                      auVar70 = vpmaxsd_avx2(auVar70,auVar72);
                      uVar28 = uVar28 - 1 & uVar28;
                      iVar33 = 0;
                      if (uVar28 == 0) {
                        auVar72 = vpermi2q_avx512vl(auVar76,auVar71,auVar69);
                        uVar40 = auVar72._0_8_;
                        auVar72 = vpermt2q_avx512vl(auVar71,auVar70,auVar69);
                        *local_2770 = auVar72._0_8_;
                        auVar72 = vmovdqa64_avx512vl(auVar84);
                        in_ZMM21 = ZEXT3264(auVar72);
                        auVar70 = vpermd_avx512vl(auVar70,auVar84);
                        *(int *)(local_2770 + 1) = auVar70._0_4_;
                        auVar70 = vpermt2q_avx512vl(auVar71,auVar78,auVar69);
                        local_2770[2] = auVar70._0_8_;
                        auVar70 = vpermd_avx512vl(auVar78,auVar84);
                        *(int *)(local_2770 + 3) = auVar70._0_4_;
                        auVar71 = vpermt2q_avx512vl(auVar71,auVar77,auVar69);
                        local_2770[4] = auVar71._0_8_;
                        auVar71 = vpermd_avx512vl(auVar77,auVar84);
                        *(int *)(local_2770 + 5) = auVar71._0_4_;
                        local_2770 = local_2770 + 6;
                        auVar105 = ZEXT3264(auVar68);
                        auVar107 = ZEXT3264(auVar73);
                        auVar110 = ZEXT3264(auVar87);
                        auVar112 = ZEXT3264(auVar112._0_32_);
                        auVar114 = ZEXT3264(auVar114._0_32_);
                        auVar116 = ZEXT3264(auVar116._0_32_);
                        auVar119 = ZEXT3264(auVar119._0_32_);
                        auVar121 = ZEXT3264(auVar121._0_32_);
                        auVar122 = ZEXT3264(auVar74);
                        auVar123 = ZEXT3264(auVar75);
                        auVar68 = vmovdqa64_avx512vl(auVar83);
                        auVar124 = ZEXT3264(auVar68);
                        auVar68 = vmovdqa64_avx512vl(auVar85);
                        auVar125 = ZEXT3264(auVar68);
                      }
                      else {
                        auVar79 = valignd_avx512vl(auVar79,auVar79,3);
                        auVar72 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                        auVar76 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                       CONCAT48(0x80000000,
                                                                                0x8000000080000000))
                                                            ),auVar72,auVar76);
                        auVar72 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                        auVar76 = vpermt2d_avx512vl(auVar76,auVar72,auVar77);
                        auVar76 = vpermt2d_avx512vl(auVar76,auVar72,auVar78);
                        auVar72 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                        auVar70 = vpermt2d_avx512vl(auVar76,auVar72,auVar70);
                        auVar105 = ZEXT3264(auVar70);
                        uVar40 = uVar28;
                        do {
                          auVar72 = auVar105._0_32_;
                          auVar81._8_4_ = 1;
                          auVar81._0_8_ = 0x100000001;
                          auVar81._12_4_ = 1;
                          auVar81._16_4_ = 1;
                          auVar81._20_4_ = 1;
                          auVar81._24_4_ = 1;
                          auVar81._28_4_ = 1;
                          auVar70 = vpermd_avx2(auVar81,auVar79);
                          auVar79 = valignd_avx512vl(auVar79,auVar79,1);
                          vpermt2q_avx512vl(auVar71,auVar79,auVar69);
                          uVar40 = uVar40 - 1 & uVar40;
                          uVar98 = vpcmpd_avx512vl(auVar70,auVar72,5);
                          auVar70 = vpmaxsd_avx2(auVar70,auVar72);
                          bVar39 = (byte)uVar98 << 1;
                          auVar72 = valignd_avx512vl(auVar72,auVar72,7);
                          bVar15 = (bool)((byte)uVar98 & 1);
                          auVar80._4_4_ =
                               (uint)bVar15 * auVar72._4_4_ | (uint)!bVar15 * auVar70._4_4_;
                          auVar80._0_4_ = auVar70._0_4_;
                          bVar15 = (bool)(bVar39 >> 2 & 1);
                          auVar80._8_4_ =
                               (uint)bVar15 * auVar72._8_4_ | (uint)!bVar15 * auVar70._8_4_;
                          bVar15 = (bool)(bVar39 >> 3 & 1);
                          auVar80._12_4_ =
                               (uint)bVar15 * auVar72._12_4_ | (uint)!bVar15 * auVar70._12_4_;
                          bVar15 = (bool)(bVar39 >> 4 & 1);
                          auVar80._16_4_ =
                               (uint)bVar15 * auVar72._16_4_ | (uint)!bVar15 * auVar70._16_4_;
                          bVar15 = (bool)(bVar39 >> 5 & 1);
                          auVar80._20_4_ =
                               (uint)bVar15 * auVar72._20_4_ | (uint)!bVar15 * auVar70._20_4_;
                          bVar15 = (bool)(bVar39 >> 6 & 1);
                          auVar80._24_4_ =
                               (uint)bVar15 * auVar72._24_4_ | (uint)!bVar15 * auVar70._24_4_;
                          auVar80._28_4_ =
                               (uint)(bVar39 >> 7) * auVar72._28_4_ |
                               (uint)!(bool)(bVar39 >> 7) * auVar70._28_4_;
                          auVar105 = ZEXT3264(auVar80);
                        } while (uVar40 != 0);
                        lVar31 = POPCOUNT(uVar28) + 3;
                        do {
                          auVar70 = vpermi2q_avx512vl(auVar80,auVar71,auVar69);
                          *local_2770 = auVar70._0_8_;
                          auVar72 = auVar105._0_32_;
                          auVar70 = vpermd_avx512vl(auVar72,auVar84);
                          *(int *)(local_2770 + 1) = auVar70._0_4_;
                          auVar80 = valignd_avx512vl(auVar72,auVar72,1);
                          local_2770 = local_2770 + 2;
                          auVar105 = ZEXT3264(auVar80);
                          lVar31 = lVar31 + -1;
                        } while (lVar31 != 0);
                        auVar71 = vpermt2q_avx512vl(auVar71,auVar80,auVar69);
                        uVar40 = auVar71._0_8_;
                        auVar105 = ZEXT3264(auVar68);
                        auVar107 = ZEXT3264(auVar73);
                        auVar110 = ZEXT3264(auVar87);
                        auVar112 = ZEXT3264(auVar112._0_32_);
                        auVar114 = ZEXT3264(auVar114._0_32_);
                        auVar116 = ZEXT3264(auVar116._0_32_);
                        auVar119 = ZEXT3264(auVar119._0_32_);
                        auVar121 = ZEXT3264(auVar121._0_32_);
                        auVar122 = ZEXT3264(auVar74);
                        auVar123 = ZEXT3264(auVar75);
                        auVar68 = vmovdqa64_avx512vl(auVar83);
                        auVar124 = ZEXT3264(auVar68);
                        auVar68 = vmovdqa64_avx512vl(auVar85);
                        auVar125 = ZEXT3264(auVar68);
                        auVar68 = vmovdqa64_avx512vl(auVar84);
                        in_ZMM21 = ZEXT3264(auVar68);
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar33 = 6;
            }
          } while (iVar33 == 0);
        } while (iVar33 != 6);
        local_2778 = unaff_R12;
        local_25a0 = vmovdqa64_avx512vl(in_ZMM21._0_32_);
        local_2760 = (ulong)((uint)uVar40 & 0xf) - 8;
        if (local_2760 != 0) {
          uVar40 = uVar40 & 0xfffffffffffffff0;
          local_27e0 = context->scene;
          local_2758 = 0;
          local_2768 = uVar40;
          do {
            lVar29 = local_2758 * 0x60;
            pRVar9 = (local_27e0->geometries).items;
            pGVar10 = pRVar9[*(uint *)(uVar40 + 0x40 + lVar29)].ptr;
            fVar95 = (pGVar10->time_range).lower;
            fVar95 = pGVar10->fnumTimeSegments *
                     (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar95) /
                     ((pGVar10->time_range).upper - fVar95));
            auVar42 = vroundss_avx(ZEXT416((uint)fVar95),ZEXT416((uint)fVar95),9);
            auVar42 = vminss_avx(auVar42,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
            auVar16 = vmaxss_avx(ZEXT816(0),auVar42);
            iVar33 = (int)auVar16._0_4_;
            lVar32 = (long)iVar33 * 0x38;
            lVar31 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar32);
            auVar42 = *(undefined1 (*) [16])(lVar31 + (ulong)*(uint *)(uVar40 + lVar29) * 4);
            uVar41 = (ulong)*(uint *)(uVar40 + 0x10 + lVar29);
            auVar66 = *(undefined1 (*) [16])(lVar31 + uVar41 * 4);
            uVar34 = (ulong)*(uint *)(uVar40 + 0x20 + lVar29);
            auVar54 = *(undefined1 (*) [16])(lVar31 + uVar34 * 4);
            uVar35 = (ulong)*(uint *)(uVar40 + 0x30 + lVar29);
            auVar43 = *(undefined1 (*) [16])(lVar31 + uVar35 * 4);
            uVar30 = (ulong)*(uint *)(uVar40 + 4 + lVar29);
            lVar36 = (long)(iVar33 + 1) * 0x38;
            lVar31 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar36);
            auVar44 = *(undefined1 (*) [16])(lVar31 + (ulong)*(uint *)(uVar40 + lVar29) * 4);
            auVar45 = *(undefined1 (*) [16])(lVar31 + uVar41 * 4);
            lVar11 = *(long *)&pRVar9[*(uint *)(uVar40 + 0x44 + lVar29)].ptr[2].numPrimitives;
            lVar12 = *(long *)(lVar11 + lVar32);
            auVar50 = *(undefined1 (*) [16])(lVar12 + uVar30 * 4);
            auVar63 = *(undefined1 (*) [16])(lVar31 + uVar34 * 4);
            uVar34 = (ulong)*(uint *)(uVar40 + 0x14 + lVar29);
            auVar52 = *(undefined1 (*) [16])(lVar12 + uVar34 * 4);
            auVar65 = *(undefined1 (*) [16])(lVar31 + uVar35 * 4);
            uVar41 = (ulong)*(uint *)(uVar40 + 0x24 + lVar29);
            auVar56 = *(undefined1 (*) [16])(lVar12 + uVar41 * 4);
            uVar35 = (ulong)*(uint *)(uVar40 + 0x34 + lVar29);
            auVar58 = *(undefined1 (*) [16])(lVar12 + uVar35 * 4);
            lVar31 = *(long *)&pRVar9[*(uint *)(uVar40 + 0x48 + lVar29)].ptr[2].numPrimitives;
            lVar11 = *(long *)(lVar11 + lVar36);
            auVar60 = *(undefined1 (*) [16])(lVar11 + uVar30 * 4);
            lVar12 = *(long *)(lVar31 + lVar32);
            auVar61 = *(undefined1 (*) [16])(lVar11 + uVar34 * 4);
            uVar30 = (ulong)*(uint *)(uVar40 + 8 + lVar29);
            auVar47 = *(undefined1 (*) [16])(lVar12 + uVar30 * 4);
            auVar64 = *(undefined1 (*) [16])(lVar11 + uVar41 * 4);
            uVar41 = (ulong)*(uint *)(uVar40 + 0x18 + lVar29);
            auVar51 = *(undefined1 (*) [16])(lVar12 + uVar41 * 4);
            auVar67 = *(undefined1 (*) [16])(lVar11 + uVar35 * 4);
            uVar34 = (ulong)*(uint *)(uVar40 + 0x28 + lVar29);
            auVar55 = *(undefined1 (*) [16])(lVar12 + uVar34 * 4);
            uVar37 = (ulong)*(uint *)(uVar40 + 0x38 + lVar29);
            auVar57 = *(undefined1 (*) [16])(lVar12 + uVar37 * 4);
            lVar31 = *(long *)(lVar31 + lVar36);
            auVar59 = *(undefined1 (*) [16])(lVar31 + uVar30 * 4);
            lVar11 = *(long *)&pRVar9[*(uint *)(uVar40 + 0x4c + lVar29)].ptr[2].numPrimitives;
            lVar12 = *(long *)(lVar11 + lVar32);
            auVar62 = *(undefined1 (*) [16])(lVar31 + uVar41 * 4);
            uVar35 = (ulong)*(uint *)(uVar40 + 0xc + lVar29);
            auVar49 = *(undefined1 (*) [16])(lVar12 + uVar35 * 4);
            auVar96 = *(undefined1 (*) [16])(lVar31 + uVar34 * 4);
            uVar30 = (ulong)*(uint *)(uVar40 + 0x1c + lVar29);
            auVar53 = *(undefined1 (*) [16])(lVar12 + uVar30 * 4);
            auVar46 = vunpcklps_avx512vl(auVar42,auVar47);
            auVar47 = vunpckhps_avx512vl(auVar42,auVar47);
            auVar48 = vunpcklps_avx512vl(auVar50,auVar49);
            auVar50 = vunpckhps_avx(auVar50,auVar49);
            auVar42 = *(undefined1 (*) [16])(lVar31 + uVar37 * 4);
            uVar41 = (ulong)*(uint *)(uVar40 + 0x2c + lVar29);
            auVar47 = vunpcklps_avx(auVar47,auVar50);
            auVar49 = vunpcklps_avx512vl(auVar46,auVar48);
            auVar46 = vunpckhps_avx512vl(auVar46,auVar48);
            auVar50 = vunpcklps_avx512vl(auVar66,auVar51);
            auVar51 = vunpckhps_avx512vl(auVar66,auVar51);
            auVar48 = vunpcklps_avx512vl(auVar52,auVar53);
            auVar52 = vunpckhps_avx512vl(auVar52,auVar53);
            auVar66 = *(undefined1 (*) [16])(lVar12 + uVar41 * 4);
            uVar34 = (ulong)*(uint *)(uVar40 + 0x3c + lVar29);
            auVar52 = vunpcklps_avx(auVar51,auVar52);
            auVar51 = vunpcklps_avx512vl(auVar50,auVar48);
            auVar50 = vunpckhps_avx(auVar50,auVar48);
            auVar53 = vunpcklps_avx512vl(auVar54,auVar55);
            auVar54 = vunpckhps_avx512vl(auVar54,auVar55);
            auVar55 = vunpcklps_avx512vl(auVar56,auVar66);
            auVar56 = vunpckhps_avx512vl(auVar56,auVar66);
            auVar66 = *(undefined1 (*) [16])(lVar12 + uVar34 * 4);
            lVar31 = *(long *)(lVar11 + lVar36);
            auVar56 = vunpcklps_avx(auVar54,auVar56);
            auVar48 = vunpcklps_avx512vl(auVar53,auVar55);
            auVar54 = vunpckhps_avx(auVar53,auVar55);
            auVar55 = vunpcklps_avx512vl(auVar43,auVar57);
            auVar43 = vunpckhps_avx512vl(auVar43,auVar57);
            auVar57 = vunpcklps_avx512vl(auVar58,auVar66);
            auVar58 = vunpckhps_avx512vl(auVar58,auVar66);
            auVar66 = *(undefined1 (*) [16])(lVar31 + uVar35 * 4);
            auVar43 = vunpcklps_avx(auVar43,auVar58);
            auVar58 = vunpcklps_avx512vl(auVar55,auVar57);
            auVar55 = vunpckhps_avx512vl(auVar55,auVar57);
            auVar57 = vunpcklps_avx512vl(auVar44,auVar59);
            auVar44 = vunpckhps_avx512vl(auVar44,auVar59);
            auVar59 = vunpcklps_avx512vl(auVar60,auVar66);
            auVar60 = vunpckhps_avx512vl(auVar60,auVar66);
            auVar66 = *(undefined1 (*) [16])(lVar31 + uVar30 * 4);
            auVar60 = vunpcklps_avx512vl(auVar44,auVar60);
            auVar53 = vunpcklps_avx512vl(auVar57,auVar59);
            auVar57 = vunpckhps_avx512vl(auVar57,auVar59);
            auVar59 = vunpcklps_avx512vl(auVar45,auVar62);
            auVar44 = vunpckhps_avx512vl(auVar45,auVar62);
            auVar45 = vunpcklps_avx512vl(auVar61,auVar66);
            auVar61 = vunpckhps_avx512vl(auVar61,auVar66);
            auVar66 = *(undefined1 (*) [16])(lVar31 + uVar41 * 4);
            auVar44 = vunpcklps_avx(auVar44,auVar61);
            auVar61 = vunpcklps_avx512vl(auVar59,auVar45);
            auVar59 = vunpckhps_avx512vl(auVar59,auVar45);
            auVar62 = vunpcklps_avx512vl(auVar63,auVar96);
            auVar45 = vunpckhps_avx512vl(auVar63,auVar96);
            auVar63 = vunpcklps_avx512vl(auVar64,auVar66);
            auVar64 = vunpckhps_avx512vl(auVar64,auVar66);
            auVar66 = *(undefined1 (*) [16])(lVar31 + uVar34 * 4);
            auVar45 = vunpcklps_avx(auVar45,auVar64);
            auVar64 = vunpcklps_avx512vl(auVar62,auVar63);
            auVar63 = vunpckhps_avx512vl(auVar62,auVar63);
            auVar62 = vunpcklps_avx512vl(auVar65,auVar42);
            auVar42 = vunpckhps_avx512vl(auVar65,auVar42);
            auVar65 = vunpcklps_avx512vl(auVar67,auVar66);
            auVar66 = vunpckhps_avx512vl(auVar67,auVar66);
            auVar42 = vunpcklps_avx(auVar42,auVar66);
            auVar67 = vunpcklps_avx512vl(auVar62,auVar65);
            auVar65 = vunpckhps_avx512vl(auVar62,auVar65);
            auVar66 = ZEXT416((uint)(fVar95 - auVar16._0_4_));
            auVar62 = vbroadcastss_avx512vl(auVar66);
            auVar66 = vsubss_avx512f(ZEXT416(0x3f800000),auVar66);
            auVar96._0_4_ = auVar66._0_4_;
            auVar96._4_4_ = auVar96._0_4_;
            auVar96._8_4_ = auVar96._0_4_;
            auVar96._12_4_ = auVar96._0_4_;
            auVar66 = vmulps_avx512vl(auVar62,auVar53);
            auVar49 = vfmadd231ps_avx512vl(auVar66,auVar96,auVar49);
            auVar66 = vmulps_avx512vl(auVar62,auVar57);
            auVar57 = vfmadd231ps_avx512vl(auVar66,auVar96,auVar46);
            auVar66 = vmulps_avx512vl(auVar62,auVar60);
            auVar66 = vfmadd231ps_fma(auVar66,auVar96,auVar47);
            auVar60 = vmulps_avx512vl(auVar62,auVar61);
            auVar61 = vmulps_avx512vl(auVar62,auVar59);
            auVar47 = vmulps_avx512vl(auVar62,auVar44);
            auVar60 = vfmadd231ps_avx512vl(auVar60,auVar96,auVar51);
            auVar44 = vfmadd231ps_fma(auVar61,auVar96,auVar50);
            auVar50 = vfmadd231ps_fma(auVar47,auVar96,auVar52);
            auVar52 = vmulps_avx512vl(auVar62,auVar64);
            auVar63 = vmulps_avx512vl(auVar62,auVar63);
            auVar45 = vmulps_avx512vl(auVar62,auVar45);
            auVar52 = vfmadd231ps_avx512vl(auVar52,auVar96,auVar48);
            auVar54 = vfmadd231ps_fma(auVar63,auVar96,auVar54);
            auVar45 = vfmadd231ps_fma(auVar45,auVar96,auVar56);
            auVar63 = vmulps_avx512vl(auVar62,auVar67);
            auVar65 = vmulps_avx512vl(auVar62,auVar65);
            auVar56 = vmulps_avx512vl(auVar62,auVar42);
            auVar42 = vfmadd231ps_fma(auVar63,auVar96,auVar58);
            auVar63 = vfmadd231ps_fma(auVar65,auVar96,auVar55);
            auVar43 = vfmadd231ps_fma(auVar56,auVar96,auVar43);
            auVar68 = vinsertf32x4_avx512vl(ZEXT1632(auVar49),auVar52,1);
            auVar73 = vinsertf32x4_avx512vl(ZEXT1632(auVar57),auVar54,1);
            auVar103._16_16_ = auVar45;
            auVar103._0_16_ = auVar66;
            auVar106._16_16_ = auVar60;
            auVar106._0_16_ = auVar60;
            auVar111._16_16_ = auVar44;
            auVar111._0_16_ = auVar44;
            auVar113._16_16_ = auVar50;
            auVar113._0_16_ = auVar50;
            auVar115._16_16_ = auVar42;
            auVar115._0_16_ = auVar42;
            auVar108._16_16_ = auVar63;
            auVar108._0_16_ = auVar63;
            uVar89 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar117._4_4_ = uVar89;
            auVar117._0_4_ = uVar89;
            auVar117._8_4_ = uVar89;
            auVar117._12_4_ = uVar89;
            auVar117._16_4_ = uVar89;
            auVar117._20_4_ = uVar89;
            auVar117._24_4_ = uVar89;
            auVar117._28_4_ = uVar89;
            uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar120._4_4_ = uVar89;
            auVar120._0_4_ = uVar89;
            auVar120._8_4_ = uVar89;
            auVar120._12_4_ = uVar89;
            auVar120._16_4_ = uVar89;
            auVar120._20_4_ = uVar89;
            auVar120._24_4_ = uVar89;
            auVar120._28_4_ = uVar89;
            auVar74 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]))
            ;
            uVar89 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar97._4_4_ = uVar89;
            auVar97._0_4_ = uVar89;
            auVar97._8_4_ = uVar89;
            auVar97._12_4_ = uVar89;
            auVar97._16_4_ = uVar89;
            auVar97._20_4_ = uVar89;
            auVar97._24_4_ = uVar89;
            auVar97._28_4_ = uVar89;
            uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar100._4_4_ = uVar89;
            auVar100._0_4_ = uVar89;
            auVar100._8_4_ = uVar89;
            auVar100._12_4_ = uVar89;
            auVar100._16_4_ = uVar89;
            auVar100._20_4_ = uVar89;
            auVar100._24_4_ = uVar89;
            auVar100._28_4_ = uVar89;
            auVar102._16_16_ = auVar43;
            auVar102._0_16_ = auVar43;
            fVar95 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar104._4_4_ = fVar95;
            auVar104._0_4_ = fVar95;
            auVar104._8_4_ = fVar95;
            auVar104._12_4_ = fVar95;
            auVar104._16_4_ = fVar95;
            auVar104._20_4_ = fVar95;
            auVar104._24_4_ = fVar95;
            auVar104._28_4_ = fVar95;
            auVar68 = vsubps_avx(auVar68,auVar117);
            auVar73 = vsubps_avx(auVar73,auVar120);
            auVar69 = vsubps_avx512vl(auVar103,auVar74);
            auVar75 = vsubps_avx512vl(auVar106,auVar117);
            auVar71 = vsubps_avx512vl(auVar111,auVar120);
            auVar70 = vsubps_avx512vl(auVar113,auVar74);
            auVar87 = vsubps_avx(auVar115,auVar117);
            auVar72 = vsubps_avx512vl(auVar108,auVar120);
            auVar76 = vsubps_avx512vl(auVar102,auVar74);
            auVar74 = vsubps_avx(auVar87,auVar68);
            auVar77 = vsubps_avx512vl(auVar72,auVar73);
            auVar78 = vsubps_avx512vl(auVar76,auVar69);
            auVar79 = vsubps_avx512vl(auVar68,auVar75);
            auVar80 = vsubps_avx512vl(auVar73,auVar71);
            auVar81 = vsubps_avx512vl(auVar69,auVar70);
            auVar90._0_4_ = auVar87._0_4_ + auVar68._0_4_;
            auVar90._4_4_ = auVar87._4_4_ + auVar68._4_4_;
            auVar90._8_4_ = auVar87._8_4_ + auVar68._8_4_;
            auVar90._12_4_ = auVar87._12_4_ + auVar68._12_4_;
            auVar90._16_4_ = auVar87._16_4_ + auVar68._16_4_;
            auVar90._20_4_ = auVar87._20_4_ + auVar68._20_4_;
            auVar90._24_4_ = auVar87._24_4_ + auVar68._24_4_;
            auVar90._28_4_ = auVar87._28_4_ + auVar68._28_4_;
            auVar82 = vaddps_avx512vl(auVar72,auVar73);
            auVar83 = vaddps_avx512vl(auVar76,auVar69);
            auVar84._4_4_ = auVar78._4_4_ * auVar82._4_4_;
            auVar84._0_4_ = auVar78._0_4_ * auVar82._0_4_;
            auVar84._8_4_ = auVar78._8_4_ * auVar82._8_4_;
            auVar84._12_4_ = auVar78._12_4_ * auVar82._12_4_;
            auVar84._16_4_ = auVar78._16_4_ * auVar82._16_4_;
            auVar84._20_4_ = auVar78._20_4_ * auVar82._20_4_;
            auVar84._24_4_ = auVar78._24_4_ * auVar82._24_4_;
            auVar84._28_4_ = auVar60._12_4_;
            auVar66 = vfmsub231ps_fma(auVar84,auVar77,auVar83);
            auVar85._4_4_ = auVar74._4_4_ * auVar83._4_4_;
            auVar85._0_4_ = auVar74._0_4_ * auVar83._0_4_;
            auVar85._8_4_ = auVar74._8_4_ * auVar83._8_4_;
            auVar85._12_4_ = auVar74._12_4_ * auVar83._12_4_;
            auVar85._16_4_ = auVar74._16_4_ * auVar83._16_4_;
            auVar85._20_4_ = auVar74._20_4_ * auVar83._20_4_;
            auVar85._24_4_ = auVar74._24_4_ * auVar83._24_4_;
            auVar85._28_4_ = auVar83._28_4_;
            auVar42 = vfmsub231ps_fma(auVar85,auVar78,auVar90);
            auVar83._4_4_ = auVar77._4_4_ * auVar90._4_4_;
            auVar83._0_4_ = auVar77._0_4_ * auVar90._0_4_;
            auVar83._8_4_ = auVar77._8_4_ * auVar90._8_4_;
            auVar83._12_4_ = auVar77._12_4_ * auVar90._12_4_;
            auVar83._16_4_ = auVar77._16_4_ * auVar90._16_4_;
            auVar83._20_4_ = auVar77._20_4_ * auVar90._20_4_;
            auVar83._24_4_ = auVar77._24_4_ * auVar90._24_4_;
            auVar83._28_4_ = auVar90._28_4_;
            auVar54 = vfmsub231ps_fma(auVar83,auVar74,auVar82);
            auVar91._0_4_ = fVar95 * auVar54._0_4_;
            auVar91._4_4_ = fVar95 * auVar54._4_4_;
            auVar91._8_4_ = fVar95 * auVar54._8_4_;
            auVar91._12_4_ = fVar95 * auVar54._12_4_;
            auVar91._16_4_ = fVar95 * 0.0;
            auVar91._20_4_ = fVar95 * 0.0;
            auVar91._24_4_ = fVar95 * 0.0;
            auVar91._28_4_ = 0;
            auVar42 = vfmadd231ps_fma(auVar91,auVar100,ZEXT1632(auVar42));
            auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar97,ZEXT1632(auVar66));
            auVar84 = vaddps_avx512vl(auVar68,auVar75);
            auVar85 = vaddps_avx512vl(auVar73,auVar71);
            auVar83 = vaddps_avx512vl(auVar69,auVar70);
            auVar82 = vmulps_avx512vl(auVar85,auVar81);
            auVar86 = vfmsub231ps_avx512vl(auVar82,auVar80,auVar83);
            auVar82._4_4_ = auVar83._4_4_ * auVar79._4_4_;
            auVar82._0_4_ = auVar83._0_4_ * auVar79._0_4_;
            auVar82._8_4_ = auVar83._8_4_ * auVar79._8_4_;
            auVar82._12_4_ = auVar83._12_4_ * auVar79._12_4_;
            auVar82._16_4_ = auVar83._16_4_ * auVar79._16_4_;
            auVar82._20_4_ = auVar83._20_4_ * auVar79._20_4_;
            auVar82._24_4_ = auVar83._24_4_ * auVar79._24_4_;
            auVar82._28_4_ = auVar83._28_4_;
            auVar83 = vfmsub231ps_avx512vl(auVar82,auVar81,auVar84);
            auVar84 = vmulps_avx512vl(auVar84,auVar80);
            auVar66 = vfmsub231ps_fma(auVar84,auVar79,auVar85);
            auVar84 = vsubps_avx512vl(auVar75,auVar87);
            auVar109._0_4_ = fVar95 * auVar66._0_4_;
            auVar109._4_4_ = fVar95 * auVar66._4_4_;
            auVar109._8_4_ = fVar95 * auVar66._8_4_;
            auVar109._12_4_ = fVar95 * auVar66._12_4_;
            auVar109._16_4_ = fVar95 * 0.0;
            auVar109._20_4_ = fVar95 * 0.0;
            auVar109._24_4_ = fVar95 * 0.0;
            auVar109._28_4_ = 0;
            auVar66 = vfmadd231ps_fma(auVar109,auVar100,auVar83);
            auVar85 = vsubps_avx512vl(auVar71,auVar72);
            local_2540 = vfmadd231ps_avx512vl(ZEXT1632(auVar66),auVar97,auVar86);
            auVar83 = vsubps_avx512vl(auVar70,auVar76);
            auVar87 = vaddps_avx512vl(auVar75,auVar87);
            auVar75 = vaddps_avx512vl(auVar71,auVar72);
            auVar71 = vaddps_avx512vl(auVar70,auVar76);
            auVar70 = vmulps_avx512vl(auVar75,auVar83);
            auVar70 = vfmsub231ps_avx512vl(auVar70,auVar85,auVar71);
            auVar71 = vmulps_avx512vl(auVar71,auVar84);
            auVar71 = vfmsub231ps_avx512vl(auVar71,auVar83,auVar87);
            auVar86._4_4_ = auVar87._4_4_ * auVar85._4_4_;
            auVar86._0_4_ = auVar87._0_4_ * auVar85._0_4_;
            auVar86._8_4_ = auVar87._8_4_ * auVar85._8_4_;
            auVar86._12_4_ = auVar87._12_4_ * auVar85._12_4_;
            auVar86._16_4_ = auVar87._16_4_ * auVar85._16_4_;
            auVar86._20_4_ = auVar87._20_4_ * auVar85._20_4_;
            auVar86._24_4_ = auVar87._24_4_ * auVar85._24_4_;
            auVar86._28_4_ = auVar87._28_4_;
            auVar87 = vfmsub231ps_avx512vl(auVar86,auVar84,auVar75);
            auVar87 = vmulps_avx512vl(auVar104,auVar87);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar100,auVar71);
            auVar70 = vfmadd231ps_avx512vl(auVar87,auVar97,auVar70);
            auVar118._0_4_ = local_2540._0_4_ + auVar42._0_4_;
            auVar118._4_4_ = local_2540._4_4_ + auVar42._4_4_;
            auVar118._8_4_ = local_2540._8_4_ + auVar42._8_4_;
            auVar118._12_4_ = local_2540._12_4_ + auVar42._12_4_;
            auVar118._16_4_ = local_2540._16_4_ + 0.0;
            auVar118._20_4_ = local_2540._20_4_ + 0.0;
            auVar118._24_4_ = local_2540._24_4_ + 0.0;
            auVar118._28_4_ = local_2540._28_4_ + 0.0;
            local_2520 = vaddps_avx512vl(auVar70,auVar118);
            auVar87._8_4_ = 0x7fffffff;
            auVar87._0_8_ = 0x7fffffff7fffffff;
            auVar87._12_4_ = 0x7fffffff;
            auVar87._16_4_ = 0x7fffffff;
            auVar87._20_4_ = 0x7fffffff;
            auVar87._24_4_ = 0x7fffffff;
            auVar87._28_4_ = 0x7fffffff;
            vandps_avx512vl(local_2520,auVar87);
            auVar75._8_4_ = 0x34000000;
            auVar75._0_8_ = 0x3400000034000000;
            auVar75._12_4_ = 0x34000000;
            auVar75._16_4_ = 0x34000000;
            auVar75._20_4_ = 0x34000000;
            auVar75._24_4_ = 0x34000000;
            auVar75._28_4_ = 0x34000000;
            auVar87 = vmulps_avx512vl(local_2520,auVar75);
            auVar75 = vminps_avx512vl(ZEXT1632(auVar42),local_2540);
            auVar75 = vminps_avx512vl(auVar75,auVar70);
            auVar71._8_4_ = 0x80000000;
            auVar71._0_8_ = 0x8000000080000000;
            auVar71._12_4_ = 0x80000000;
            auVar71._16_4_ = 0x80000000;
            auVar71._20_4_ = 0x80000000;
            auVar71._24_4_ = 0x80000000;
            auVar71._28_4_ = 0x80000000;
            auVar71 = vxorps_avx512vl(auVar87,auVar71);
            uVar98 = vcmpps_avx512vl(auVar75,auVar71,5);
            auVar75 = vmaxps_avx512vl(ZEXT1632(auVar42),local_2540);
            auVar75 = vmaxps_avx512vl(auVar75,auVar70);
            uVar17 = vcmpps_avx512vl(auVar75,auVar87,2);
            auVar87 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar40 + 0x10 + lVar29));
            local_2580 = vmovdqa64_avx512vl(auVar87);
            auVar87 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar40 + 0x14 + lVar29));
            local_2700 = vmovdqa64_avx512vl(auVar87);
            local_24a0 = (byte)uVar98 | (byte)uVar17;
            if (local_24a0 != 0) {
              auVar87 = vmulps_avx512vl(auVar78,auVar80);
              auVar75 = vmulps_avx512vl(auVar74,auVar81);
              auVar71 = vmulps_avx512vl(auVar77,auVar79);
              auVar70 = vmulps_avx512vl(auVar81,auVar85);
              auVar72 = vmulps_avx512vl(auVar79,auVar83);
              auVar76 = vmulps_avx512vl(auVar80,auVar84);
              auVar77 = vfmsub213ps_avx512vl(auVar77,auVar81,auVar87);
              auVar78 = vfmsub213ps_avx512vl(auVar78,auVar79,auVar75);
              auVar74 = vfmsub213ps_avx512vl(auVar74,auVar80,auVar71);
              auVar83 = vfmsub213ps_avx512vl(auVar83,auVar80,auVar70);
              auVar84 = vfmsub213ps_avx512vl(auVar84,auVar81,auVar72);
              auVar79 = vfmsub213ps_avx512vl(auVar85,auVar79,auVar76);
              auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              vandps_avx512vl(auVar87,auVar85);
              vandps_avx512vl(auVar70,auVar85);
              uVar41 = vcmpps_avx512vl(auVar85,auVar85,1);
              vandps_avx512vl(auVar75,auVar85);
              vandps_avx512vl(auVar72,auVar85);
              uVar30 = vcmpps_avx512vl(auVar85,auVar85,1);
              vandps_avx512vl(auVar71,auVar85);
              vandps_avx512vl(auVar76,auVar85);
              uVar34 = vcmpps_avx512vl(auVar85,auVar85,1);
              bVar15 = (bool)((byte)uVar41 & 1);
              local_2500._0_4_ =
                   (float)((uint)bVar15 * auVar77._0_4_ | (uint)!bVar15 * auVar83._0_4_);
              bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
              local_2500._4_4_ =
                   (float)((uint)bVar15 * auVar77._4_4_ | (uint)!bVar15 * auVar83._4_4_);
              bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
              local_2500._8_4_ =
                   (float)((uint)bVar15 * auVar77._8_4_ | (uint)!bVar15 * auVar83._8_4_);
              bVar15 = (bool)((byte)(uVar41 >> 3) & 1);
              local_2500._12_4_ =
                   (float)((uint)bVar15 * auVar77._12_4_ | (uint)!bVar15 * auVar83._12_4_);
              bVar15 = (bool)((byte)(uVar41 >> 4) & 1);
              local_2500._16_4_ =
                   (float)((uint)bVar15 * auVar77._16_4_ | (uint)!bVar15 * auVar83._16_4_);
              bVar15 = (bool)((byte)(uVar41 >> 5) & 1);
              local_2500._20_4_ =
                   (float)((uint)bVar15 * auVar77._20_4_ | (uint)!bVar15 * auVar83._20_4_);
              bVar15 = (bool)((byte)(uVar41 >> 6) & 1);
              local_2500._24_4_ =
                   (float)((uint)bVar15 * auVar77._24_4_ | (uint)!bVar15 * auVar83._24_4_);
              bVar15 = SUB81(uVar41 >> 7,0);
              local_2500._28_4_ = (uint)bVar15 * auVar77._28_4_ | (uint)!bVar15 * auVar83._28_4_;
              bVar15 = (bool)((byte)uVar30 & 1);
              local_24e0._0_4_ =
                   (float)((uint)bVar15 * auVar78._0_4_ | (uint)!bVar15 * auVar84._0_4_);
              bVar15 = (bool)((byte)(uVar30 >> 1) & 1);
              local_24e0._4_4_ =
                   (float)((uint)bVar15 * auVar78._4_4_ | (uint)!bVar15 * auVar84._4_4_);
              bVar15 = (bool)((byte)(uVar30 >> 2) & 1);
              local_24e0._8_4_ =
                   (float)((uint)bVar15 * auVar78._8_4_ | (uint)!bVar15 * auVar84._8_4_);
              bVar15 = (bool)((byte)(uVar30 >> 3) & 1);
              local_24e0._12_4_ =
                   (float)((uint)bVar15 * auVar78._12_4_ | (uint)!bVar15 * auVar84._12_4_);
              bVar15 = (bool)((byte)(uVar30 >> 4) & 1);
              local_24e0._16_4_ =
                   (float)((uint)bVar15 * auVar78._16_4_ | (uint)!bVar15 * auVar84._16_4_);
              bVar15 = (bool)((byte)(uVar30 >> 5) & 1);
              local_24e0._20_4_ =
                   (float)((uint)bVar15 * auVar78._20_4_ | (uint)!bVar15 * auVar84._20_4_);
              bVar15 = (bool)((byte)(uVar30 >> 6) & 1);
              local_24e0._24_4_ =
                   (float)((uint)bVar15 * auVar78._24_4_ | (uint)!bVar15 * auVar84._24_4_);
              bVar15 = SUB81(uVar30 >> 7,0);
              local_24e0._28_4_ = (uint)bVar15 * auVar78._28_4_ | (uint)!bVar15 * auVar84._28_4_;
              bVar15 = (bool)((byte)uVar34 & 1);
              local_24c0._0_4_ =
                   (float)((uint)bVar15 * auVar74._0_4_ | (uint)!bVar15 * auVar79._0_4_);
              bVar15 = (bool)((byte)(uVar34 >> 1) & 1);
              local_24c0._4_4_ =
                   (float)((uint)bVar15 * auVar74._4_4_ | (uint)!bVar15 * auVar79._4_4_);
              bVar15 = (bool)((byte)(uVar34 >> 2) & 1);
              local_24c0._8_4_ =
                   (float)((uint)bVar15 * auVar74._8_4_ | (uint)!bVar15 * auVar79._8_4_);
              bVar15 = (bool)((byte)(uVar34 >> 3) & 1);
              local_24c0._12_4_ =
                   (float)((uint)bVar15 * auVar74._12_4_ | (uint)!bVar15 * auVar79._12_4_);
              bVar15 = (bool)((byte)(uVar34 >> 4) & 1);
              local_24c0._16_4_ =
                   (float)((uint)bVar15 * auVar74._16_4_ | (uint)!bVar15 * auVar79._16_4_);
              bVar15 = (bool)((byte)(uVar34 >> 5) & 1);
              local_24c0._20_4_ =
                   (float)((uint)bVar15 * auVar74._20_4_ | (uint)!bVar15 * auVar79._20_4_);
              bVar15 = (bool)((byte)(uVar34 >> 6) & 1);
              local_24c0._24_4_ =
                   (float)((uint)bVar15 * auVar74._24_4_ | (uint)!bVar15 * auVar79._24_4_);
              bVar15 = SUB81(uVar34 >> 7,0);
              local_24c0._28_4_ = (uint)bVar15 * auVar74._28_4_ | (uint)!bVar15 * auVar79._28_4_;
              auVar25._4_4_ = fVar95 * local_24c0._4_4_;
              auVar25._0_4_ = fVar95 * local_24c0._0_4_;
              auVar25._8_4_ = fVar95 * local_24c0._8_4_;
              auVar25._12_4_ = fVar95 * local_24c0._12_4_;
              auVar25._16_4_ = fVar95 * local_24c0._16_4_;
              auVar25._20_4_ = fVar95 * local_24c0._20_4_;
              auVar25._24_4_ = fVar95 * local_24c0._24_4_;
              auVar25._28_4_ = fVar95;
              auVar66 = vfmadd213ps_fma(auVar100,local_24e0,auVar25);
              auVar66 = vfmadd213ps_fma(auVar97,local_2500,ZEXT1632(auVar66));
              auVar87 = ZEXT1632(CONCAT412(auVar66._12_4_ + auVar66._12_4_,
                                           CONCAT48(auVar66._8_4_ + auVar66._8_4_,
                                                    CONCAT44(auVar66._4_4_ + auVar66._4_4_,
                                                             auVar66._0_4_ + auVar66._0_4_))));
              auVar101._0_4_ = auVar69._0_4_ * local_24c0._0_4_;
              auVar101._4_4_ = auVar69._4_4_ * local_24c0._4_4_;
              auVar101._8_4_ = auVar69._8_4_ * local_24c0._8_4_;
              auVar101._12_4_ = auVar69._12_4_ * local_24c0._12_4_;
              auVar101._16_4_ = auVar69._16_4_ * local_24c0._16_4_;
              auVar101._20_4_ = auVar69._20_4_ * local_24c0._20_4_;
              auVar101._24_4_ = auVar69._24_4_ * local_24c0._24_4_;
              auVar101._28_4_ = 0;
              auVar66 = vfmadd213ps_fma(auVar73,local_24e0,auVar101);
              auVar54 = vfmadd213ps_fma(auVar68,local_2500,ZEXT1632(auVar66));
              auVar68 = vrcp14ps_avx512vl(auVar87);
              auVar74._8_4_ = 0x3f800000;
              auVar74._0_8_ = &DAT_3f8000003f800000;
              auVar74._12_4_ = 0x3f800000;
              auVar74._16_4_ = 0x3f800000;
              auVar74._20_4_ = 0x3f800000;
              auVar74._24_4_ = 0x3f800000;
              auVar74._28_4_ = 0x3f800000;
              auVar73 = vfnmadd213ps_avx512vl(auVar68,auVar87,auVar74);
              auVar66 = vfmadd132ps_fma(auVar73,auVar68,auVar68);
              local_2440 = ZEXT1632(CONCAT412((auVar54._12_4_ + auVar54._12_4_) * auVar66._12_4_,
                                              CONCAT48((auVar54._8_4_ + auVar54._8_4_) *
                                                       auVar66._8_4_,
                                                       CONCAT44((auVar54._4_4_ + auVar54._4_4_) *
                                                                auVar66._4_4_,
                                                                (auVar54._0_4_ + auVar54._0_4_) *
                                                                auVar66._0_4_))));
              uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar20._4_4_ = uVar89;
              auVar20._0_4_ = uVar89;
              auVar20._8_4_ = uVar89;
              auVar20._12_4_ = uVar89;
              auVar20._16_4_ = uVar89;
              auVar20._20_4_ = uVar89;
              auVar20._24_4_ = uVar89;
              auVar20._28_4_ = uVar89;
              uVar98 = vcmpps_avx512vl(local_2440,auVar20,0xd);
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar21._16_4_ = 0x80000000;
              auVar21._20_4_ = 0x80000000;
              auVar21._24_4_ = 0x80000000;
              auVar21._28_4_ = 0x80000000;
              auVar68 = vxorps_avx512vl(auVar87,auVar21);
              fVar95 = (ray->super_RayK<1>).tfar;
              auVar22._4_4_ = fVar95;
              auVar22._0_4_ = fVar95;
              auVar22._8_4_ = fVar95;
              auVar22._12_4_ = fVar95;
              auVar22._16_4_ = fVar95;
              auVar22._20_4_ = fVar95;
              auVar22._24_4_ = fVar95;
              auVar22._28_4_ = fVar95;
              uVar17 = vcmpps_avx512vl(local_2440,auVar22,2);
              uVar18 = vcmpps_avx512vl(auVar87,auVar68,4);
              local_24a0 = (byte)uVar98 & (byte)uVar17 & (byte)uVar18 & local_24a0;
              uVar41 = (ulong)local_24a0;
              if (local_24a0 != 0) {
                local_2560 = ZEXT1632(auVar42);
                local_23c0 = 0xf0;
                auVar23._8_4_ = 0x219392ef;
                auVar23._0_8_ = 0x219392ef219392ef;
                auVar23._12_4_ = 0x219392ef;
                auVar23._16_4_ = 0x219392ef;
                auVar23._20_4_ = 0x219392ef;
                auVar23._24_4_ = 0x219392ef;
                auVar23._28_4_ = 0x219392ef;
                uVar30 = vcmpps_avx512vl(local_2520,auVar23,5);
                auVar73 = vrcp14ps_avx512vl(local_2520);
                auVar99._8_4_ = 0x3f800000;
                auVar99._0_8_ = &DAT_3f8000003f800000;
                auVar99._12_4_ = 0x3f800000;
                auVar99._16_4_ = 0x3f800000;
                auVar99._20_4_ = 0x3f800000;
                auVar99._24_4_ = 0x3f800000;
                auVar99._28_4_ = 0x3f800000;
                auVar66 = vfnmadd213ps_fma(local_2520,auVar73,auVar99);
                auVar68 = vfmadd132ps_avx512vl(ZEXT1632(auVar66),auVar73,auVar73);
                fVar1 = (float)((uint)((byte)uVar30 & 1) * auVar68._0_4_);
                fVar95 = (float)((uint)((byte)(uVar30 >> 1) & 1) * auVar68._4_4_);
                fVar2 = (float)((uint)((byte)(uVar30 >> 2) & 1) * auVar68._8_4_);
                fVar3 = (float)((uint)((byte)(uVar30 >> 3) & 1) * auVar68._12_4_);
                fVar4 = (float)((uint)((byte)(uVar30 >> 4) & 1) * auVar68._16_4_);
                fVar5 = (float)((uint)((byte)(uVar30 >> 5) & 1) * auVar68._20_4_);
                fVar6 = (float)((uint)((byte)(uVar30 >> 6) & 1) * auVar68._24_4_);
                auVar92._0_4_ = fVar1 * auVar42._0_4_;
                auVar92._4_4_ = fVar95 * auVar42._4_4_;
                auVar92._8_4_ = fVar2 * auVar42._8_4_;
                auVar92._12_4_ = fVar3 * auVar42._12_4_;
                auVar92._16_4_ = fVar4 * 0.0;
                auVar92._20_4_ = fVar5 * 0.0;
                auVar92._24_4_ = fVar6 * 0.0;
                auVar92._28_4_ = 0;
                auVar68 = vminps_avx(auVar92,auVar99);
                auVar26._4_4_ = local_2540._4_4_ * fVar95;
                auVar26._0_4_ = local_2540._0_4_ * fVar1;
                auVar26._8_4_ = local_2540._8_4_ * fVar2;
                auVar26._12_4_ = local_2540._12_4_ * fVar3;
                auVar26._16_4_ = local_2540._16_4_ * fVar4;
                auVar26._20_4_ = local_2540._20_4_ * fVar5;
                auVar26._24_4_ = local_2540._24_4_ * fVar6;
                auVar26._28_4_ = auVar73._28_4_;
                auVar73 = vminps_avx(auVar26,auVar99);
                auVar87 = vsubps_avx(auVar99,auVar68);
                auVar74 = vsubps_avx(auVar99,auVar73);
                local_2460 = vblendps_avx(auVar73,auVar87,0xf0);
                local_2480 = vblendps_avx(auVar68,auVar74,0xf0);
                local_2420[0] = local_2500._0_4_ * 1.0;
                local_2420[1] = local_2500._4_4_ * 1.0;
                local_2420[2] = local_2500._8_4_ * 1.0;
                local_2420[3] = local_2500._12_4_ * 1.0;
                fStack_2410 = local_2500._16_4_ * -1.0;
                fStack_240c = local_2500._20_4_ * -1.0;
                fStack_2408 = local_2500._24_4_ * -1.0;
                uStack_2404 = local_2480._28_4_;
                local_2400[0] = local_24e0._0_4_ * 1.0;
                local_2400[1] = local_24e0._4_4_ * 1.0;
                local_2400[2] = local_24e0._8_4_ * 1.0;
                local_2400[3] = local_24e0._12_4_ * 1.0;
                fStack_23f0 = local_24e0._16_4_ * -1.0;
                fStack_23ec = local_24e0._20_4_ * -1.0;
                fStack_23e8 = local_24e0._24_4_ * -1.0;
                uStack_23e4 = local_2460._28_4_;
                local_23e0[0] = local_24c0._0_4_ * 1.0;
                local_23e0[1] = local_24c0._4_4_ * 1.0;
                local_23e0[2] = local_24c0._8_4_ * 1.0;
                local_23e0[3] = local_24c0._12_4_ * 1.0;
                fStack_23d0 = local_24c0._16_4_ * -1.0;
                fStack_23cc = local_24c0._20_4_ * -1.0;
                fStack_23c8 = local_24c0._24_4_ * -1.0;
                uStack_23c4 = local_24e0._28_4_;
                auVar93._8_4_ = 0x7f800000;
                auVar93._0_8_ = 0x7f8000007f800000;
                auVar93._12_4_ = 0x7f800000;
                auVar93._16_4_ = 0x7f800000;
                auVar93._20_4_ = 0x7f800000;
                auVar93._24_4_ = 0x7f800000;
                auVar93._28_4_ = 0x7f800000;
                auVar68 = vblendmps_avx512vl(auVar93,local_2440);
                auVar88._0_4_ =
                     (uint)(local_24a0 & 1) * auVar68._0_4_ |
                     (uint)!(bool)(local_24a0 & 1) * 0x7f800000;
                bVar15 = (bool)(local_24a0 >> 1 & 1);
                auVar88._4_4_ = (uint)bVar15 * auVar68._4_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)(local_24a0 >> 2 & 1);
                auVar88._8_4_ = (uint)bVar15 * auVar68._8_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)(local_24a0 >> 3 & 1);
                auVar88._12_4_ = (uint)bVar15 * auVar68._12_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)(local_24a0 >> 4 & 1);
                auVar88._16_4_ = (uint)bVar15 * auVar68._16_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)(local_24a0 >> 5 & 1);
                auVar88._20_4_ = (uint)bVar15 * auVar68._20_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)(local_24a0 >> 6 & 1);
                auVar88._24_4_ = (uint)bVar15 * auVar68._24_4_ | (uint)!bVar15 * 0x7f800000;
                auVar88._28_4_ =
                     (uint)(local_24a0 >> 7) * auVar68._28_4_ |
                     (uint)!(bool)(local_24a0 >> 7) * 0x7f800000;
                auVar68 = vshufps_avx(auVar88,auVar88,0xb1);
                auVar68 = vminps_avx(auVar88,auVar68);
                auVar73 = vshufpd_avx(auVar68,auVar68,5);
                auVar68 = vminps_avx(auVar68,auVar73);
                auVar73 = vpermpd_avx2(auVar68,0x4e);
                auVar68 = vminps_avx(auVar68,auVar73);
                uVar98 = vcmpps_avx512vl(auVar88,auVar68,0);
                bVar39 = local_24a0;
                if (((byte)uVar98 & local_24a0) != 0) {
                  bVar39 = (byte)uVar98 & local_24a0;
                }
                local_2720 = local_2440;
                do {
                  uVar19 = 0;
                  for (uVar27 = (uint)bVar39; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000)
                  {
                    uVar19 = uVar19 + 1;
                  }
                  uVar27 = *(uint *)(local_2580 + (ulong)uVar19 * 4);
                  pGVar10 = (local_27e0->geometries).items[uVar27].ptr;
                  if ((pGVar10->mask & (ray->super_RayK<1>).mask) == 0) {
                    uVar41 = (ulong)(byte)(~(byte)(1 << (uVar19 & 0x1f)) & (byte)uVar41);
LAB_01fce2e6:
                    bVar15 = true;
                  }
                  else {
                    pRVar13 = context->args;
                    if ((pRVar13->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      uVar30 = (ulong)(uVar19 * 4);
                      local_27d8.context = context->user;
                      local_2750 = *(float *)((long)local_2420 + uVar30);
                      local_274c = *(undefined4 *)((long)local_2400 + uVar30);
                      local_2748 = *(undefined4 *)((long)local_23e0 + uVar30);
                      local_2744 = *(undefined4 *)(local_2480 + uVar30);
                      local_2740 = *(undefined4 *)(local_2460 + uVar30);
                      local_273c = *(undefined4 *)(local_2700 + uVar30);
                      local_2738 = uVar27;
                      local_2734 = (local_27d8.context)->instID[0];
                      local_2730 = (local_27d8.context)->instPrimID[0];
                      fVar95 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_2440 + uVar30);
                      local_27e4 = -1;
                      local_27d8.valid = &local_27e4;
                      local_27d8.geometryUserPtr = pGVar10->userPtr;
                      local_27d8.ray = (RTCRayN *)ray;
                      local_27d8.hit = (RTCHitN *)&local_2750;
                      local_27d8.N = 1;
                      if ((pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar10->intersectionFilterN)(&local_27d8), *local_27d8.valid != 0)) {
                        if (pRVar13->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar13->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar10->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar13->filter)(&local_27d8);
                          }
                          if (*local_27d8.valid == 0) goto LAB_01fce4c7;
                        }
                        (((Vec3f *)((long)local_27d8.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_27d8.hit;
                        (((Vec3f *)((long)local_27d8.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_27d8.hit + 4);
                        (((Vec3f *)((long)local_27d8.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_27d8.hit + 8);
                        *(float *)((long)local_27d8.ray + 0x3c) = *(float *)(local_27d8.hit + 0xc);
                        *(float *)((long)local_27d8.ray + 0x40) = *(float *)(local_27d8.hit + 0x10);
                        *(float *)((long)local_27d8.ray + 0x44) = *(float *)(local_27d8.hit + 0x14);
                        *(float *)((long)local_27d8.ray + 0x48) = *(float *)(local_27d8.hit + 0x18);
                        *(float *)((long)local_27d8.ray + 0x4c) = *(float *)(local_27d8.hit + 0x1c);
                        *(float *)((long)local_27d8.ray + 0x50) = *(float *)(local_27d8.hit + 0x20);
                      }
                      else {
LAB_01fce4c7:
                        (ray->super_RayK<1>).tfar = fVar95;
                      }
                      fVar95 = (ray->super_RayK<1>).tfar;
                      auVar24._4_4_ = fVar95;
                      auVar24._0_4_ = fVar95;
                      auVar24._8_4_ = fVar95;
                      auVar24._12_4_ = fVar95;
                      auVar24._16_4_ = fVar95;
                      auVar24._20_4_ = fVar95;
                      auVar24._24_4_ = fVar95;
                      auVar24._28_4_ = fVar95;
                      uVar30 = vcmpps_avx512vl(local_2720,auVar24,2);
                      uVar41 = (byte)(~(byte)(1 << (uVar19 & 0x1f)) & (byte)uVar41) & uVar30;
                      goto LAB_01fce2e6;
                    }
                    bVar15 = false;
                  }
                  uVar40 = local_2768;
                  if (!bVar15) {
                    uVar41 = (ulong)(uVar19 << 2);
                    fVar95 = *(float *)(local_2480 + uVar41);
                    fVar2 = *(float *)(local_2460 + uVar41);
                    (ray->super_RayK<1>).tfar = *(float *)(local_2440 + uVar41);
                    (ray->Ng).field_0.field_0.x = *(float *)((long)local_2420 + uVar41);
                    (ray->Ng).field_0.field_0.y = *(float *)((long)local_2400 + uVar41);
                    (ray->Ng).field_0.field_0.z = *(float *)((long)local_23e0 + uVar41);
                    ray->u = fVar95;
                    ray->v = fVar2;
                    ray->primID = *(uint *)(local_2700 + uVar41);
                    ray->geomID = uVar27;
                    pRVar14 = context->user;
                    ray->instID[0] = pRVar14->instID[0];
                    ray->instPrimID[0] = pRVar14->instPrimID[0];
                    break;
                  }
                  if ((char)uVar41 == '\0') break;
                  BVHNIntersector1<8,16777232,true,embree::avx512::ArrayIntersector1<embree::avx512::QuadMiMBIntersector1Pluecker<4,true>>>
                  ::intersect();
                  bVar39 = (byte)local_27d8.valid;
                } while( true );
              }
            }
            local_2758 = local_2758 + 1;
          } while (local_2758 != local_2760);
        }
        fVar95 = (ray->super_RayK<1>).tfar;
        auVar94 = ZEXT3264(CONCAT428(fVar95,CONCAT424(fVar95,CONCAT420(fVar95,CONCAT416(fVar95,
                                                  CONCAT412(fVar95,CONCAT48(fVar95,CONCAT44(fVar95,
                                                  fVar95))))))));
        auVar105 = ZEXT3264(local_25c0);
        auVar107 = ZEXT3264(local_25e0);
        auVar110 = ZEXT3264(local_2600);
        auVar112 = ZEXT3264(local_2620);
        auVar114 = ZEXT3264(local_2640);
        auVar116 = ZEXT3264(local_2660);
        auVar119 = ZEXT3264(local_2680);
        auVar121 = ZEXT3264(local_26a0);
        auVar122 = ZEXT3264(local_26c0);
        auVar123 = ZEXT3264(local_26e0);
        auVar68 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
        auVar124 = ZEXT3264(auVar68);
        auVar68 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
        auVar125 = ZEXT3264(auVar68);
        auVar68 = vmovdqa64_avx512vl(local_25a0);
        in_ZMM21 = ZEXT3264(auVar68);
        uVar41 = local_27a8;
        uVar30 = local_2780;
        uVar34 = local_2788;
        uVar35 = local_2790;
        uVar37 = local_2798;
        uVar38 = local_27a0;
        unaff_R12 = local_2778;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }